

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int set_url(void)

{
  int iVar1;
  char *local_28;
  char *url;
  CURLU *urlp;
  int local_10;
  CURLUcode rc;
  int error;
  int i;
  
  local_10 = 0;
  rc = CURLUE_OK;
  while ((set_url_list[(int)rc].in != (char *)0x0 && local_10 == 0 &&
         (url = (char *)curl_url(), url != (char *)0x0))) {
    urlp._4_4_ = curl_url_set(url,0,set_url_list[(int)rc].in,set_url_list[(int)rc].urlflags);
    if (urlp._4_4_ == CURLUE_OK) {
      urlp._4_4_ = curl_url_set(url,0,set_url_list[(int)rc].set,set_url_list[(int)rc].setflags);
      if (urlp._4_4_ == CURLUE_OK) {
        local_28 = (char *)0x0;
        urlp._4_4_ = curl_url_get(url,0,&local_28);
        if (urlp._4_4_ == CURLUE_OK) {
          iVar1 = checkurl(local_28,set_url_list[(int)rc].out);
          if (iVar1 != 0) {
            local_10 = local_10 + 1;
          }
        }
        else {
          curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                        ,0x2d6,urlp._4_4_);
          local_10 = local_10 + 1;
        }
        curl_free(local_28);
      }
      else {
        curl_mfprintf(_stderr,"%s:%d Set URL %s returned %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                      ,0x2cd,set_url_list[(int)rc].set,urlp._4_4_);
        local_10 = local_10 + 1;
      }
    }
    else if (urlp._4_4_ != set_url_list[(int)rc].ucode) {
      curl_mfprintf(_stderr,"Set URL\nin: %s\nreturned %d (expected %d)\n",set_url_list[(int)rc].in,
                    urlp._4_4_,set_url_list[(int)rc].ucode);
      local_10 = local_10 + 1;
    }
    curl_url_cleanup(url);
    rc = rc + CURLUE_BAD_HANDLE;
  }
  return local_10;
}

Assistant:

static int set_url(void)
{
  int i;
  int error = 0;

  for(i = 0; set_url_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp)
      break;
    rc = curl_url_set(urlp, CURLUPART_URL, set_url_list[i].in,
                      set_url_list[i].urlflags);
    if(!rc) {
      rc = curl_url_set(urlp, CURLUPART_URL, set_url_list[i].set,
                        set_url_list[i].setflags);
      if(rc) {
        fprintf(stderr, "%s:%d Set URL %s returned %d\n",
                __FILE__, __LINE__, set_url_list[i].set,
                (int)rc);
        error++;
      }
      else {
        char *url = NULL;
        rc = curl_url_get(urlp, CURLUPART_URL, &url, 0);
        if(rc) {
          fprintf(stderr, "%s:%d Get URL returned %d\n",
                  __FILE__, __LINE__, (int)rc);
          error++;
        }
        else {
          if(checkurl(url, set_url_list[i].out)) {
            error++;
          }
        }
        curl_free(url);
      }
    }
    else if(rc != set_url_list[i].ucode) {
      fprintf(stderr, "Set URL\nin: %s\nreturned %d (expected %d)\n",
              set_url_list[i].in, (int)rc, set_url_list[i].ucode);
      error++;
    }
    curl_url_cleanup(urlp);
  }
  return error;
}